

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O2

int dwarf_dnames_header(Dwarf_Debug dbg,Dwarf_Off starting_offset,Dwarf_Dnames_Head *dn_out,
                       Dwarf_Off *offset_of_next_table,Dwarf_Error *error)

{
  Dwarf_Small *pDVar1;
  size_t __size;
  Dwarf_Small DVar2;
  Dwarf_Debug dbg_00;
  Dwarf_D_Abbrev_s *pDVar3;
  Dwarf_Unsigned inlen;
  Dwarf_Unsigned DVar4;
  int iVar5;
  Dwarf_Dnames_Head dn;
  long lVar6;
  Dwarf_Small *pDVar7;
  Dwarf_D_Abbrev_s *pDVar8;
  char *pcVar9;
  char *pcVar10;
  Dwarf_Signed DVar11;
  ulong uVar12;
  Dwarf_Unsigned DVar13;
  Dwarf_Small *pDVar14;
  Dwarf_Unsigned DVar15;
  Dwarf_Small *pDVar16;
  Dwarf_D_Abbrev_s *pDVar17;
  uint uVar18;
  long lVar19;
  undefined8 *puVar20;
  bool bVar21;
  byte bVar22;
  Dwarf_Small *local_128;
  Dwarf_Small *local_120;
  Dwarf_Small *local_110;
  Dwarf_Unsigned local_108;
  undefined1 local_100 [48];
  Dwarf_D_Abbrev_s *local_d0;
  Dwarf_Small *local_c8;
  Dwarf_Small *local_c0;
  Dwarf_Small *local_b8;
  Dwarf_Unsigned _ltmp;
  Dwarf_Small *local_90;
  Dwarf_Unsigned augmentation_string_size;
  Dwarf_Unsigned abbrev_table_size;
  Dwarf_Unsigned name_count;
  Dwarf_Unsigned bucket_count;
  Dwarf_Unsigned foreign_type_unit_count;
  Dwarf_Unsigned local_type_unit_count;
  Dwarf_Unsigned comp_unit_count;
  Dwarf_Unsigned form;
  Dwarf_Unsigned tag;
  Dwarf_Unsigned code;
  Dwarf_Small *local_38;
  
  bVar22 = 0;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_dnames_header()either null or it containsa stale Dwarf_Debug pointer"
                       );
    return 1;
  }
  iVar5 = _dwarf_load_section(dbg,&dbg->de_debug_names,error);
  if (iVar5 != 0) {
    return iVar5;
  }
  local_c0 = (Dwarf_Small *)(dbg->de_debug_names).dss_size;
  if (local_c0 == (Dwarf_Small *)0x0) {
    return -1;
  }
  iVar5 = _dwarf_load_section(dbg,&dbg->de_debug_str,error);
  if (iVar5 == 1) {
    return 1;
  }
  local_c8 = local_c0 + -starting_offset;
  if (local_c0 < starting_offset || local_c8 == (Dwarf_Small *)0x0) {
    return -1;
  }
  pDVar14 = (dbg->de_debug_names).dss_data + starting_offset;
  dn = (Dwarf_Dnames_Head)_dwarf_get_alloc(dbg,'?',1);
  if (dn == (Dwarf_Dnames_Head)0x0) {
    pcVar9 = "DW_DLE_ALLOC_FAIL: dwarf_get_alloc of a Dwarf_Dnames_Head record failed.";
    DVar11 = 0x3e;
LAB_0014d7d3:
    _dwarf_error_string(dbg,error,DVar11,pcVar9);
    return 1;
  }
  dn->dn_magic = 0xabcd;
  dn->dn_section_data = pDVar14;
  dn->dn_section_size = (Dwarf_Unsigned)local_c0;
  dn->dn_section_end = local_c0 + (long)pDVar14;
  dn->dn_dbg = dbg;
  dn->dn_section_offset = starting_offset;
  dn->dn_indextable_data = pDVar14 + starting_offset;
  comp_unit_count = 0;
  local_type_unit_count = 0;
  foreign_type_unit_count = 0;
  bucket_count = 0;
  name_count = 0;
  abbrev_table_size = 0;
  augmentation_string_size = 0;
  _ltmp = 0;
  if ((long)local_c0 < 4) goto LAB_0014d790;
  local_120 = pDVar14 + 4;
  local_100._16_8_ = pDVar14;
  local_38 = local_c0 + (long)pDVar14;
  (*dbg->de_copy_word)(&_ltmp,pDVar14,4);
  if (_ltmp == 0) {
    if (dbg->de_big_endian_object != '\0') {
      if (dbg->de_length_size == '\b') {
        _ltmp = 0;
        if (local_c0 < (Dwarf_Small *)0x8) goto LAB_0014d790;
        (*dbg->de_copy_word)(&_ltmp,(void *)local_100._16_8_,8);
        if (local_c8 < _ltmp) goto LAB_0014d927;
        local_120 = (Dwarf_Small *)(local_100._16_8_ + 8);
        uVar18 = 8;
        lVar6 = 0;
        DVar15 = _ltmp;
      }
      else {
        DVar15 = 0;
LAB_0014d944:
        uVar18 = 4;
        lVar6 = 0;
      }
LAB_0014d949:
      dn->dn_offset_size = (Dwarf_Half)uVar18;
      if (local_c8 < (Dwarf_Small *)((ulong)uVar18 + lVar6 + DVar15)) {
        pcVar9 = 
        "DW_DLE_DEBUG_NAMES_HEADER_ERROR: The index table runs off the end of the .debug_names section. Corrupt data."
        ;
LAB_0014d979:
        DVar11 = 0x174;
      }
      else {
        pDVar16 = (Dwarf_Small *)(ulong)(uVar18 + (int)lVar6);
        pDVar14 = pDVar16 + DVar15;
        if (local_c8 < pDVar14) {
          pcVar9 = 
          "DW_DLE_DEBUG_NAMES_HEADER_ERROR: The index table runs off the end of the .debug_names section... Corrupt data."
          ;
          goto LAB_0014d979;
        }
        pDVar7 = local_120 + DVar15;
        dn->dn_unit_length = lVar6 + DVar15;
        dn->dn_indextable_data_end = pDVar7;
        dn->dn_next_set_offset = (Dwarf_Unsigned)(pDVar14 + starting_offset);
        _ltmp = _ltmp & 0xffffffffffff0000;
        if (1 < (long)DVar15) {
          pDVar1 = local_120 + 2;
          local_100._8_8_ = pDVar16;
          (*dbg->de_copy_word)(&_ltmp,local_120,2);
          local_110 = pDVar1;
          if (DVar15 == 2) {
LAB_0014da0c:
            DVar11 = 0x174;
          }
          else {
            if ((short)_ltmp == 5) {
              _ltmp = _ltmp & 0xffffffffffff0000;
              if (DVar15 < 4) goto LAB_0014d790;
              local_120 = local_120 + 4;
              (*dbg->de_copy_word)(&_ltmp,pDVar1,2);
              local_110 = local_120;
              if ((DVar15 == 4) || ((short)_ltmp != 0)) goto LAB_0014da0c;
              iVar5 = read_uword_val(dbg,&local_110,pDVar7,0x174,&comp_unit_count,
                                     (Dwarf_Unsigned)pDVar14,error);
              DVar15 = comp_unit_count;
              if (iVar5 != 0) goto LAB_0014d989;
              if (dn->dn_section_size < comp_unit_count) {
                pcVar9 = "DW_DLE_DEBUG_NAMES_ERROR comp_unit_count too large";
              }
              else {
                dn->dn_comp_unit_count = comp_unit_count;
                iVar5 = read_uword_val(dbg,&local_110,pDVar7,0x174,&local_type_unit_count,
                                       (Dwarf_Unsigned)pDVar14,error);
                DVar13 = local_type_unit_count;
                if (iVar5 != 0) goto LAB_0014d989;
                if (dn->dn_section_size < local_type_unit_count) {
                  pcVar9 = "DW_DLE_DEBUG_NAMES_ERROR local_type_unit_count large";
                }
                else {
                  dn->dn_local_type_unit_count = local_type_unit_count;
                  iVar5 = read_uword_val(dbg,&local_110,pDVar7,0x174,&foreign_type_unit_count,
                                         (Dwarf_Unsigned)pDVar14,error);
                  DVar4 = foreign_type_unit_count;
                  if (iVar5 != 0) goto LAB_0014d989;
                  if (dn->dn_section_size < foreign_type_unit_count) {
                    pcVar9 = "DW_DLE_DEBUG_NAMES_ERROR: foreign_type_unit_count large";
                  }
                  else {
                    dn->dn_foreign_type_unit_count = foreign_type_unit_count;
                    iVar5 = read_uword_val(dbg,&local_110,pDVar7,0x174,&bucket_count,
                                           (Dwarf_Unsigned)pDVar14,error);
                    if (iVar5 != 0) goto LAB_0014d989;
                    local_108 = bucket_count;
                    if (dn->dn_section_size < bucket_count) {
                      pcVar9 = "DW_DLE_DEBUG_NAMES_ERROR bucketcount too large";
                    }
                    else {
                      dn->dn_bucket_count = bucket_count;
                      iVar5 = read_uword_val(dbg,&local_110,pDVar7,0x174,&name_count,
                                             (Dwarf_Unsigned)pDVar14,error);
                      if (iVar5 != 0) goto LAB_0014d989;
                      local_d0 = (Dwarf_D_Abbrev_s *)name_count;
                      dn->dn_name_count = name_count;
                      if (dn->dn_section_size < name_count) {
                        pcVar9 = "DW_DLE_DEBUG_NAMES_ERROR name_count too large";
                      }
                      else {
                        iVar5 = read_uword_val(dbg,&local_110,pDVar7,0x174,&abbrev_table_size,
                                               (Dwarf_Unsigned)pDVar14,error);
                        if (iVar5 != 0) goto LAB_0014d989;
                        local_100._24_8_ = abbrev_table_size;
                        if (dn->dn_section_size < abbrev_table_size) {
                          pcVar9 = "DW_DLE_DEBUG_NAMES_ERROR abbrev_table_size too large";
                        }
                        else {
                          dn->dn_abbrev_table_size = abbrev_table_size;
                          iVar5 = read_uword_val(dbg,&local_110,pDVar7,0x174,
                                                 &augmentation_string_size,(Dwarf_Unsigned)pDVar14,
                                                 error);
                          inlen = augmentation_string_size;
                          if (iVar5 != 0) goto LAB_0014d989;
                          if (augmentation_string_size <= dn->dn_section_size) {
                            local_100._40_8_ = local_110;
                            local_100._32_8_ = local_110 + augmentation_string_size;
                            dn->dn_augmentation_string_size = augmentation_string_size;
                            if (pDVar7 <= (ulong)local_100._32_8_) goto LAB_0014da0c;
                            dn->dn_version = 5;
                            dn->dn_abbrev_table_size = local_100._24_8_;
                            if (augmentation_string_size == 0) {
LAB_0014de5b:
                              pDVar16 = (Dwarf_Small *)(local_100._8_8_ + inlen + 0x20);
                              dn->dn_cu_list = (Dwarf_Small *)local_100._32_8_;
                              dn->dn_cu_list_offset = (Dwarf_Unsigned)pDVar16;
                              uVar12 = (ulong)dn->dn_offset_size;
                              lVar6 = DVar15 * uVar12;
                              pDVar14 = (Dwarf_Small *)
                                        (local_100._8_8_ + lVar6 + inlen + starting_offset + 0x20);
                              local_128 = (Dwarf_Small *)dn->dn_next_set_offset;
                              if (pDVar14 < local_128) {
                                pDVar16 = pDVar16 + lVar6;
                                dn->dn_local_tu_list = (Dwarf_Small *)(local_100._32_8_ + lVar6);
                                dn->dn_local_tu_list_offset = (Dwarf_Unsigned)pDVar16;
                                lVar19 = DVar13 * uVar12;
                                if (pDVar14 + lVar19 < local_128) {
                                  pDVar7 = (Dwarf_Small *)(local_100._32_8_ + lVar6) + lVar19;
                                  dn->dn_foreign_tu_list = pDVar7;
                                  dn->dn_foreign_tu_list_offset = (Dwarf_Unsigned)(pDVar16 + lVar19)
                                  ;
                                  pDVar14 = pDVar14 + lVar19 + DVar4 * 8;
                                  if (pDVar14 < local_128) {
                                    pDVar1 = pDVar7 + DVar4 * 8;
                                    pDVar16 = pDVar16 + lVar19 + DVar4 * 8;
                                    dn->dn_buckets_offset = (Dwarf_Unsigned)pDVar16;
                                    dn->dn_buckets = pDVar1;
                                    lVar6 = local_108 * 4;
                                    if (pDVar14 + lVar6 < local_128) {
                                      if (DVar15 == 1) {
                                        _ltmp = 0;
                                        if (pDVar7 < (Dwarf_Small *)(local_100._32_8_ + uVar12))
                                        goto LAB_0014d790;
                                        (*dbg->de_copy_word)(&_ltmp,(void *)local_100._32_8_,uVar12)
                                        ;
                                        dn->dn_single_cu = 1;
                                        dn->dn_single_cu_offset = _ltmp;
                                        local_128 = (Dwarf_Small *)dn->dn_next_set_offset;
                                      }
                                      dn->dn_hash_table = pDVar1 + local_108 * 4;
                                      dn->dn_hash_table_offset =
                                           (Dwarf_Unsigned)(pDVar16 + local_108 * 4);
                                      pDVar7 = pDVar14 + lVar6 + (long)local_d0 * 4;
                                      if (local_108 == 0) {
                                        pDVar7 = pDVar14;
                                      }
                                      pDVar14 = pDVar16 + local_108 * 4 + (long)local_d0 * 4;
                                      if (local_108 == 0) {
                                        pDVar14 = pDVar16;
                                      }
                                      if (pDVar7 < local_128) {
                                        pDVar16 = pDVar1 + local_108 * 4 + (long)local_d0 * 4;
                                        if (local_108 == 0) {
                                          pDVar16 = pDVar1;
                                        }
                                        dn->dn_string_offsets = pDVar16;
                                        dn->dn_string_offsets_offset = (Dwarf_Unsigned)pDVar14;
                                        lVar6 = (ulong)dn->dn_offset_size * (long)local_d0;
                                        if (pDVar7 + lVar6 < local_128) {
                                          dn->dn_entry_offsets = pDVar16 + lVar6;
                                          dn->dn_entry_offsets_offset =
                                               (Dwarf_Unsigned)(pDVar14 + lVar6);
                                          pDVar7 = pDVar7 + lVar6 + lVar6;
                                          if (pDVar7 < local_128) {
                                            pDVar16 = pDVar16 + lVar6 + lVar6;
                                            dn->dn_abbrevs = pDVar16;
                                            dn->dn_abbrevs_offset = (Dwarf_Unsigned)pDVar7;
                                            DVar15 = dn->dn_abbrev_table_size;
                                            pDVar7 = pDVar7 + DVar15;
                                            DVar13 = (long)local_128 - (long)pDVar7;
                                            if (pDVar7 <= local_128 && DVar13 != 0) {
                                              pDVar1 = pDVar16 + DVar15;
                                              dn->dn_entry_pool = pDVar1;
                                              dn->dn_entry_pool_offset = (Dwarf_Unsigned)pDVar7;
                                              dn->dn_entry_pool_size = DVar13;
                                              local_110 = pDVar1 + DVar13;
                                              code = 0;
                                              tag = 0;
                                              local_100._0_8_ = (Dwarf_D_Abbrev_s *)0x0;
                                              local_100._24_8_ =
                                                   pDVar14 + lVar6 + DVar13 + DVar15 + lVar6;
                                              dbg_00 = dn->dn_dbg;
                                              local_108 = 0;
                                              local_100._8_8_ = pDVar16;
                                              local_d0 = (Dwarf_D_Abbrev_s *)local_100;
                                              local_b8 = pDVar16;
LAB_0014e148:
                                              if ((ulong)local_100._8_8_ < pDVar1) {
                                                _ltmp = 0;
                                                form = 0;
                                                iVar5 = read_uword_ab(&local_b8,&code,dbg_00,error,
                                                                      pDVar1);
                                                DVar15 = code;
                                                if (iVar5 == 0) {
                                                  if (code == 0) {
                                                    if (local_b8 < pDVar1) {
                                                      uVar18 = 1;
                                                      local_100._8_8_ = local_b8;
                                                      for (pDVar14 = local_b8; pDVar14 < pDVar1;
                                                          pDVar14 = pDVar14 + 1) {
                                                        if (*pDVar14 != '\0') {
                                                          dwarfstring_constructor
                                                                    ((dwarfstring_s *)&_ltmp);
                                                          dwarfstring_append_printf_u
                                                                    ((dwarfstring_s *)&_ltmp,
                                                                                                                                          
                                                  "WARNING NON NULL debug_names abbreviation pad. padcount %u at "
                                                  ,(ulong)uVar18);
                                                  dwarfstring_append_printf_u
                                                            ((dwarfstring_s *)&_ltmp,
                                                             ".debug_names sec_offset 0x%lx",
                                                             local_100._8_8_ -
                                                             (long)dn->dn_section_data);
                                                  pcVar9 = dwarfstring_string((dwarfstring_s *)
                                                                              &_ltmp);
                                                  dwarf_insert_harmless_error(dbg_00,pcVar9);
                                                  dwarfstring_destructor((dwarfstring_s *)&_ltmp);
                                                  }
                                                  local_100._8_8_ = local_100._8_8_ + 1;
                                                  uVar18 = uVar18 + 1;
                                                  }
                                                  }
                                                  pDVar8 = (Dwarf_D_Abbrev_s *)
                                                           calloc(local_108,0x50);
                                                  dn->dn_abbrev_instances = pDVar8;
                                                  if (pDVar8 != (Dwarf_D_Abbrev_s *)0x0) {
                                                    dn->dn_abbrev_instance_count = local_108;
                                                    lVar6 = 0;
                                                    pDVar8 = (Dwarf_D_Abbrev_s *)local_100._0_8_;
                                                    while (bVar21 = local_108 != 0,
                                                          local_108 = local_108 - 1, bVar21) {
                                                      pDVar3 = pDVar8->da_next;
                                                      pDVar17 = pDVar8;
                                                      puVar20 = (undefined8 *)
                                                                ((long)dn->dn_abbrev_instances->
                                                                       da_idxattr + lVar6 + -0x28);
                                                      for (lVar19 = 10; lVar19 != 0;
                                                          lVar19 = lVar19 + -1) {
                                                        *puVar20 = pDVar17->da_next;
                                                        pDVar17 = (Dwarf_D_Abbrev_s *)
                                                                  ((long)pDVar17 +
                                                                  (ulong)bVar22 * -0x10 + 8);
                                                        puVar20 = puVar20 + (ulong)bVar22 * -2 + 1;
                                                      }
                                                      *(undefined8 *)
                                                       ((long)dn->dn_abbrev_instances->da_idxattr +
                                                       lVar6 + -0x28) = 0;
                                                      free(pDVar8);
                                                      lVar6 = lVar6 + 0x50;
                                                      pDVar8 = pDVar3;
                                                    }
                                                    if ((ulong)local_100._24_8_ <= local_c0) {
                                                      if ((ulong)((long)local_c8 - local_100._24_8_)
                                                          < 0xf && local_c8 !=
                                                                   (Dwarf_Small *)local_100._24_8_)
                                                      {
                                                        local_100._16_8_ =
                                                             local_100._16_8_ + local_100._24_8_;
                                                        while ((ulong)local_100._16_8_ < local_38) {
                                                          DVar2 = *(Dwarf_Small *)local_100._16_8_;
                                                          local_100._16_8_ = local_100._16_8_ + 1;
                                                          if (DVar2 != '\0') {
                                                            dwarf_dealloc(dbg,dn,0x3f);
                                                            pcVar9 = 
                                                  "DW_DLE_DEBUG_NAMES_PAD_NON_ZERO: space at end of valid tables not zeros"
                                                  ;
                                                  DVar11 = 0x176;
                                                  goto LAB_0014d7d3;
                                                  }
                                                  }
                                                  }
                                                  *dn_out = dn;
                                                  *offset_of_next_table = (Dwarf_Off)local_128;
                                                  return 0;
                                                  }
                                                  dwarf_dealloc_dnames(dn);
                                                  pcVar9 = 
                                                  "DW_DLE_DEBUG_NAMES_OFF_END:  used space > section size"
                                                  ;
                                                  DVar11 = 0x177;
                                                  goto LAB_0014d7d3;
                                                  }
                                                  }
                                                  else {
                                                    iVar5 = read_uword_ab(&local_b8,&tag,dbg_00,
                                                                          error,pDVar1);
                                                    if (iVar5 != 0) goto LAB_0014e334;
                                                    local_90 = local_b8;
                                                    pDVar8 = (Dwarf_D_Abbrev_s *)calloc(1,0x50);
                                                    if (pDVar8 != (Dwarf_D_Abbrev_s *)0x0)
                                                    goto code_r0x0014e1f3;
                                                  }
                                                  free_temp_abbrevs((Dwarf_D_Abbrev_s *)
                                                                    local_100._0_8_);
                                                  _dwarf_error(dbg_00,error,0x3e);
                                                }
                                                else {
LAB_0014e334:
                                                  free_temp_abbrevs((Dwarf_D_Abbrev_s *)
                                                                    local_100._0_8_);
                                                }
                                              }
                                              else {
                                                free_temp_abbrevs((Dwarf_D_Abbrev_s *)
                                                                  local_100._0_8_);
                                                pcVar9 = 
                                                "DW_DLE_DEBUG_NAMES_ABBREV_CORRUPTION: Never foundabbrev final NUL byte"
                                                ;
LAB_0014e359:
                                                _dwarf_error_string(dbg_00,error,0x179,pcVar9);
                                              }
                                              free(dn->dn_augmentation_string);
                                              dn->dn_augmentation_string = (char *)0x0;
                                              goto LAB_0014d989;
                                            }
                                            pcVar9 = 
                                            "DW_DLE_DEBUG_NAMES_HEADER_ERROR: abbrev table error";
                                          }
                                          else {
                                            pcVar9 = 
                                            "DW_DLE_DEBUG_NAMES_HEADER_ERROR: entry offsets array error"
                                            ;
                                          }
                                        }
                                        else {
                                          pcVar9 = 
                                          "DW_DLE_DEBUG_NAMES_HEADER_ERROR: string offsets array error"
                                          ;
                                        }
                                      }
                                      else {
                                        pcVar9 = 
                                        "DW_DLE_DEBUG_NAMES_HEADER_ERROR: hashes array error";
                                      }
                                    }
                                    else {
                                      pcVar9 = 
                                      "DW_DLE_DEBUG_NAMES_HEADER_ERROR:  bucket array error";
                                    }
                                  }
                                  else {
                                    pcVar9 = 
                                    "DW_DLE_DEBUG_NAMES_HEADER_ERROR: foreign_type__unit array error"
                                    ;
                                  }
                                }
                                else {
                                  pcVar9 = 
                                  "DW_DLE_DEBUG_NAMES_HEADER_ERROR: local_type__unit array error";
                                }
                              }
                              else {
                                pcVar9 = "DW_DLE_DEBUG_NAMES_HEADER_ERROR: comp_unit array error";
                              }
                              goto LAB_0014d979;
                            }
                            __size = augmentation_string_size + 1;
                            pcVar9 = (char *)calloc(1,__size);
                            dn->dn_augmentation_string = pcVar9;
                            _dwarf_safe_strcpy(pcVar9,__size,(char *)local_100._40_8_,inlen);
                            pcVar10 = dn->dn_augmentation_string;
                            pcVar9 = pcVar10 + inlen;
                            lVar6 = 0;
                            for (; (pcVar10 < pcVar9 && (*pcVar10 != '\0')); pcVar10 = pcVar10 + 1)
                            {
                              lVar6 = lVar6 + -1;
                            }
                            if ((inlen & 3) != 0) {
                              dwarfstring_constructor((dwarfstring_s *)&_ltmp);
                              dwarfstring_append_printf_u
                                        ((dwarfstring_s *)&_ltmp,
                                         "DW_DLE_DEBUG_NAMES_PAD_NON_ZERO: The augmentation_string_size  is %u, not a multiple of four"
                                         ,inlen);
                              pcVar9 = dwarfstring_string((dwarfstring_s *)&_ltmp);
                              _dwarf_error_string(dbg,error,0x176,pcVar9);
                              dwarfstring_destructor((dwarfstring_s *)&_ltmp);
                              goto LAB_0014d989;
                            }
                            if (inlen + lVar6 == 0) goto LAB_0014de5b;
                            local_100._40_8_ = local_100._40_8_ + -lVar6;
                            do {
                              if ((ulong)local_100._32_8_ <= (ulong)local_100._40_8_)
                              goto LAB_0014de5b;
                              DVar2 = *(Dwarf_Small *)local_100._40_8_;
                              local_100._40_8_ = local_100._40_8_ + 1;
                            } while (DVar2 == '\0');
                            pcVar9 = 
                            "DW_DLE_DEBUG_NAMES_PAD_NON_ZERO: padding in augmentation string not zeros"
                            ;
                            DVar11 = 0x176;
                            goto LAB_0014d97e;
                          }
                          pcVar9 = "DW_DLE_DEBUG_NAMES_ERROR augmentation string too long";
                        }
                      }
                    }
                  }
                }
              }
              DVar11 = 0x1e4;
              goto LAB_0014d97e;
            }
            DVar11 = 0x30;
          }
          _dwarf_error(dbg,error,DVar11);
          goto LAB_0014d989;
        }
LAB_0014d790:
        pcVar9 = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
        DVar11 = 0x14b;
      }
LAB_0014d97e:
      _dwarf_error_string(dbg,error,DVar11,pcVar9);
      goto LAB_0014d989;
    }
LAB_0014d922:
    DVar15 = _ltmp;
    if (_ltmp <= local_c8) goto LAB_0014d944;
  }
  else {
    if (_ltmp != 0xffffffff) goto LAB_0014d922;
    _ltmp = 0;
    local_110 = local_120;
    if (local_c0 < (Dwarf_Small *)0xc) goto LAB_0014d790;
    local_110 = local_120;
    (*dbg->de_copy_word)(&_ltmp,local_120,8);
    if (_ltmp <= local_c8) {
      lVar6 = 4;
      local_120 = (Dwarf_Small *)(local_100._16_8_ + 0xc);
      uVar18 = 8;
      DVar15 = _ltmp;
      goto LAB_0014d949;
    }
  }
LAB_0014d927:
  _dwarf_create_area_len_error(dbg,error,_ltmp,(Dwarf_Unsigned)local_c8);
LAB_0014d989:
  dwarf_dealloc_dnames(dn);
  return 1;
code_r0x0014e1f3:
  pDVar8->da_abbrev_offset = local_100._8_8_ - (long)pDVar16;
  pDVar8->da_abbrev_code = DVar15;
  pDVar8->da_tag = tag;
  local_108 = local_108 + 1;
  do {
    iVar5 = read_uword_ab(&local_90,&_ltmp,dbg_00,error,pDVar1);
    if ((iVar5 != 0) || (iVar5 = read_uword_ab(&local_90,&form,dbg_00,error,pDVar1), iVar5 != 0)) {
      free_temp_abbrevs(pDVar8);
      goto LAB_0014e334;
    }
    DVar15 = pDVar8->da_pairs_count;
    if (DVar15 == 10) {
      free_temp_abbrevs(pDVar8);
      free_temp_abbrevs((Dwarf_D_Abbrev_s *)local_100._0_8_);
      pcVar9 = 
      "DW_DLE_DEBUG_NAMES_ABBREV_CORRUPTION: Impossible: too many idxattr/form pairscorrupt abbrevs"
      ;
      goto LAB_0014e359;
    }
    pDVar8->da_idxattr[DVar15] = (Dwarf_Half)_ltmp;
    pDVar8->da_form[DVar15] = (Dwarf_Half)form;
    pDVar8->da_pairs_count = DVar15 + 1;
  } while (_ltmp != 0 || form != 0);
  local_100._8_8_ = local_90;
  local_b8 = local_90;
  local_d0->da_next = pDVar8;
  local_d0 = pDVar8;
  goto LAB_0014e148;
}

Assistant:

int
dwarf_dnames_header(Dwarf_Debug dbg,
    Dwarf_Off           starting_offset,
    Dwarf_Dnames_Head * dn_out,
    Dwarf_Off         * offset_of_next_table,
    Dwarf_Error       * error)
{
    Dwarf_Unsigned    remaining    = 0;
    Dwarf_Dnames_Head dn           = 0;
    Dwarf_Unsigned    section_size = 0;
    Dwarf_Unsigned    usedspace    = 0;
    Dwarf_Unsigned    next_offset  = 0;
    Dwarf_Small      *start_section= 0;
    Dwarf_Small      *end_section  = 0;
    Dwarf_Small      *curptr       = 0;
    int              res           = 0;

    CHECK_DBG(dbg,error,"dwarf_dnames_header()");
    res = _dwarf_load_section(dbg, &dbg->de_debug_names, error);
    if (res != DW_DLV_OK) {
        return res;
    }
    section_size = dbg->de_debug_names.dss_size;
    if (!section_size){
        return DW_DLV_NO_ENTRY;
    }
    res = _dwarf_load_section(dbg, &dbg->de_debug_str,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (starting_offset >= section_size) {
        return DW_DLV_NO_ENTRY;
    }
    start_section = dbg->de_debug_names.dss_data;
    curptr = start_section += starting_offset;
    end_section = start_section + section_size;
    dn =  (Dwarf_Dnames_Head)_dwarf_get_alloc(dbg,
        DW_DLA_DNAMES_HEAD, 1);
    if (!dn) {
        _dwarf_error_string(dbg, error, DW_DLE_ALLOC_FAIL,
            "DW_DLE_ALLOC_FAIL: dwarf_get_alloc of "
            "a Dwarf_Dnames_Head record failed.");
        return DW_DLV_ERROR;
    }
    dn->dn_magic = DWARF_DNAMES_MAGIC;
    dn->dn_section_data = start_section;
    dn->dn_section_size = section_size;
    dn->dn_section_end = start_section + section_size;
    dn->dn_dbg = dbg;
    dn->dn_section_offset = starting_offset;
    dn->dn_indextable_data = starting_offset + start_section;;
    remaining = dn->dn_section_size - starting_offset;
    res = read_a_name_table_header(dn,
        starting_offset,
        remaining,
        curptr,
        &usedspace,
        &next_offset,
        dn->dn_section_end,
        error);
    if (res == DW_DLV_ERROR) {
        dwarf_dealloc_dnames(dn);
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        /*  Impossible. A bug. Or possibly
            a bunch of zero pad? */
        dwarf_dealloc_dnames(dn);
        return res;
    }
    if (usedspace > section_size) {
        dwarf_dealloc_dnames(dn);
        _dwarf_error_string(dbg, error,DW_DLE_DEBUG_NAMES_OFF_END,
            "DW_DLE_DEBUG_NAMES_OFF_END: "
            " used space > section size");
        return DW_DLV_ERROR;
    }
    remaining -= usedspace;
    if (remaining && remaining < 15) {
        /*  No more content in here, just padding. Check for zero
            in padding. */
        curptr += usedspace;
        for ( ; curptr < end_section; ++curptr) {
            if (*curptr) {
                /*  One could argue this is a harmless error,
                    but for now assume it is real corruption. */
                dwarf_dealloc(dbg,dn,DW_DLA_DNAMES_HEAD);
                _dwarf_error_string(dbg, error,
                    DW_DLE_DEBUG_NAMES_PAD_NON_ZERO,
                    "DW_DLE_DEBUG_NAMES_PAD_NON_ZERO: "
                    "space at end of valid tables not zeros");
                return DW_DLV_ERROR;
            }
        }
    }
    *dn_out = dn;
    *offset_of_next_table = next_offset;
    return DW_DLV_OK;
}